

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Matcher.cpp
# Opt level: O0

bool Kernel::MatchingUtils::haveReversedVariantArgs(Term *l1,Term *l2)

{
  TermList t2;
  TermList t2_00;
  TermList t2_01;
  bool bVar1;
  undefined1 uVar2;
  undefined1 uVar3;
  int iVar4;
  uint uVar5;
  uint key;
  uint uVar6;
  uint uVar7;
  TermList *pTVar8;
  VirtualIterator<std::pair<Kernel::TermList,_Kernel::TermList>_> *i1;
  IterTraits<Lib::CatIterator<Lib::VirtualIterator<std::pair<Kernel::TermList,_Kernel::TermList>_>,_Lib::IterTraits<Lib::IterTraits<Lib::CatIterator<Lib::VirtualIterator<std::pair<Kernel::TermList,_Kernel::TermList>_>,_Lib::IterTraits<Lib::VirtualIterator<std::pair<Kernel::TermList,_Kernel::TermList>_>_>_>_>_>_>_>
  *it;
  Term *in_RSI;
  Term *in_RDI;
  pair<Kernel::TermList,_Kernel::TermList> pVar9;
  uint right;
  uint left;
  pair<Kernel::TermList,_Kernel::TermList> dp;
  VirtualIterator<std::pair<Kernel::TermList,_Kernel::TermList>_> dsit;
  IterTraits<Lib::CatIterator<Lib::VirtualIterator<std::pair<Kernel::TermList,_Kernel::TermList>_>,_Lib::IterTraits<Lib::VirtualIterator<std::pair<Kernel::TermList,_Kernel::TermList>_>_>_>_>
  it1;
  bool sortUsed;
  TermList s2;
  TermList s1;
  IteratorCore<std::pair<Kernel::TermList,_Kernel::TermList>_> *in_stack_fffffffffffffe28;
  undefined4 in_stack_fffffffffffffe30;
  uint in_stack_fffffffffffffe34;
  uint in_stack_fffffffffffffe40;
  undefined4 in_stack_fffffffffffffe48;
  undefined4 in_stack_fffffffffffffe4c;
  undefined2 in_stack_fffffffffffffe54;
  undefined8 in_stack_fffffffffffffe58;
  DisagreementSetIterator *in_stack_fffffffffffffe60;
  undefined7 in_stack_fffffffffffffe68;
  undefined1 in_stack_fffffffffffffe6f;
  TermList in_stack_fffffffffffffe70;
  undefined4 in_stack_fffffffffffffeb0;
  uint uVar10;
  undefined4 in_stack_fffffffffffffeb4;
  TermList in_stack_fffffffffffffeb8;
  TermList local_140;
  byte local_131;
  byte local_112;
  byte local_111;
  byte local_f1;
  uint64_t local_f0;
  uint64_t local_e8;
  undefined1 local_d9;
  uint64_t local_d8;
  uint64_t local_98;
  uint64_t local_90;
  uint64_t local_80;
  uint64_t local_78;
  uint64_t local_50;
  uint64_t local_48;
  byte local_39;
  TermList local_38;
  TermList local_30 [3];
  Term *local_18;
  Term *local_10;
  byte local_1;
  
  uVar2 = (undefined1)((ulong)in_stack_fffffffffffffe58 >> 0x38);
  local_18 = in_RSI;
  local_10 = in_RDI;
  if ((haveReversedVariantArgs(Kernel::Term*,Kernel::Term*)::leftToRight == '\0') &&
     (iVar4 = __cxa_guard_acquire(&haveReversedVariantArgs(Kernel::Term*,Kernel::Term*)::leftToRight
                                 ), iVar4 != 0)) {
    Lib::DHMap<unsigned_int,_unsigned_int,_Lib::IdentityHash,_Lib::DefaultHash>::DHMap
              (&haveReversedVariantArgs::leftToRight);
    __cxa_atexit(Lib::DHMap<unsigned_int,_unsigned_int,_Lib::IdentityHash,_Lib::DefaultHash>::~DHMap
                 ,&haveReversedVariantArgs::leftToRight,&__dso_handle);
    __cxa_guard_release(&haveReversedVariantArgs(Kernel::Term*,Kernel::Term*)::leftToRight);
  }
  if ((haveReversedVariantArgs(Kernel::Term*,Kernel::Term*)::rightToLeft == '\0') &&
     (iVar4 = __cxa_guard_acquire(&haveReversedVariantArgs(Kernel::Term*,Kernel::Term*)::rightToLeft
                                 ), iVar4 != 0)) {
    Lib::DHMap<unsigned_int,_unsigned_int,_Lib::IdentityHash,_Lib::DefaultHash>::DHMap
              (&haveReversedVariantArgs::rightToLeft);
    __cxa_atexit(Lib::DHMap<unsigned_int,_unsigned_int,_Lib::IdentityHash,_Lib::DefaultHash>::~DHMap
                 ,&haveReversedVariantArgs::rightToLeft,&__dso_handle);
    __cxa_guard_release(&haveReversedVariantArgs(Kernel::Term*,Kernel::Term*)::rightToLeft);
  }
  Lib::DHMap<unsigned_int,_unsigned_int,_Lib::IdentityHash,_Lib::DefaultHash>::reset
            (&haveReversedVariantArgs::leftToRight);
  Lib::DHMap<unsigned_int,_unsigned_int,_Lib::IdentityHash,_Lib::DefaultHash>::reset
            (&haveReversedVariantArgs::rightToLeft);
  TermList::TermList(local_30);
  TermList::TermList(&local_38);
  local_39 = 0;
  bVar1 = Term::isLiteral((Term *)0x8ae03a);
  if ((bVar1) && (bVar1 = Term::isTwoVarEquality(local_10), bVar1)) {
    bVar1 = Term::isLiteral((Term *)0x8ae066);
    if ((!bVar1) || (bVar1 = Term::isTwoVarEquality(local_18), !bVar1)) {
      local_1 = 0;
      goto LAB_008ae821;
    }
    local_48 = (uint64_t)
               SortHelper::getEqualityArgumentSort
                         ((Literal *)CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48));
    local_30[0] = (TermList)local_48;
    local_50 = (uint64_t)
               SortHelper::getEqualityArgumentSort
                         ((Literal *)CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48));
    local_39 = 1;
    local_38 = (TermList)local_50;
  }
  ::operator_new(0x48);
  pTVar8 = Term::nthArgument(local_10,0);
  local_78 = pTVar8->_content;
  pTVar8 = Term::nthArgument(local_18,1);
  local_80 = pTVar8->_content;
  t2._content._7_1_ = in_stack_fffffffffffffe6f;
  t2._content._0_7_ = in_stack_fffffffffffffe68;
  DisagreementSetIterator::DisagreementSetIterator
            (in_stack_fffffffffffffe60,in_stack_fffffffffffffe70,t2,(bool)uVar2);
  Lib::vi<std::pair<Kernel::TermList,Kernel::TermList>>(in_stack_fffffffffffffe28);
  i1 = (VirtualIterator<std::pair<Kernel::TermList,_Kernel::TermList>_> *)::operator_new(0x48);
  pTVar8 = Term::nthArgument(local_10,1);
  local_90 = pTVar8->_content;
  it = (IterTraits<Lib::CatIterator<Lib::VirtualIterator<std::pair<Kernel::TermList,_Kernel::TermList>_>,_Lib::IterTraits<Lib::IterTraits<Lib::CatIterator<Lib::VirtualIterator<std::pair<Kernel::TermList,_Kernel::TermList>_>,_Lib::IterTraits<Lib::VirtualIterator<std::pair<Kernel::TermList,_Kernel::TermList>_>_>_>_>_>_>_>
        *)Term::nthArgument(local_18,0);
  local_98 = *(uint64_t *)&it->_iter;
  t2_00._content._7_1_ = in_stack_fffffffffffffe6f;
  t2_00._content._0_7_ = in_stack_fffffffffffffe68;
  DisagreementSetIterator::DisagreementSetIterator
            (in_stack_fffffffffffffe60,in_stack_fffffffffffffe70,t2_00,(bool)uVar2);
  Lib::vi<std::pair<Kernel::TermList,Kernel::TermList>>(in_stack_fffffffffffffe28);
  Lib::
  concatIters<Lib::VirtualIterator<std::pair<Kernel::TermList,Kernel::TermList>>,Lib::VirtualIterator<std::pair<Kernel::TermList,Kernel::TermList>>>
            (i1,(VirtualIterator<std::pair<Kernel::TermList,_Kernel::TermList>_> *)pTVar8);
  Lib::VirtualIterator<std::pair<Kernel::TermList,_Kernel::TermList>_>::~VirtualIterator
            ((VirtualIterator<std::pair<Kernel::TermList,_Kernel::TermList>_> *)
             CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30));
  Lib::VirtualIterator<std::pair<Kernel::TermList,_Kernel::TermList>_>::~VirtualIterator
            ((VirtualIterator<std::pair<Kernel::TermList,_Kernel::TermList>_> *)
             CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30));
  local_d9 = 0;
  local_f1 = 0;
  local_111 = 0;
  local_112 = 0;
  local_131 = 0;
  if ((local_39 & 1) == 0) {
    Lib::
    IterTraits<Lib::CatIterator<Lib::VirtualIterator<std::pair<Kernel::TermList,_Kernel::TermList>_>,_Lib::IterTraits<Lib::VirtualIterator<std::pair<Kernel::TermList,_Kernel::TermList>_>_>_>_>
    ::IterTraits((IterTraits<Lib::CatIterator<Lib::VirtualIterator<std::pair<Kernel::TermList,_Kernel::TermList>_>,_Lib::IterTraits<Lib::VirtualIterator<std::pair<Kernel::TermList,_Kernel::TermList>_>_>_>_>
                  *)CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30),
                 (IterTraits<Lib::CatIterator<Lib::VirtualIterator<std::pair<Kernel::TermList,_Kernel::TermList>_>,_Lib::IterTraits<Lib::VirtualIterator<std::pair<Kernel::TermList,_Kernel::TermList>_>_>_>_>
                  *)in_stack_fffffffffffffe28);
    local_131 = 1;
    Lib::
    pvi<Lib::IterTraits<Lib::CatIterator<Lib::VirtualIterator<std::pair<Kernel::TermList,Kernel::TermList>>,Lib::IterTraits<Lib::VirtualIterator<std::pair<Kernel::TermList,Kernel::TermList>>>>>>
              ((IterTraits<Lib::CatIterator<Lib::VirtualIterator<std::pair<Kernel::TermList,_Kernel::TermList>_>,_Lib::IterTraits<Lib::VirtualIterator<std::pair<Kernel::TermList,_Kernel::TermList>_>_>_>_>
                *)CONCAT17(in_stack_fffffffffffffe6f,in_stack_fffffffffffffe68));
  }
  else {
    local_d8 = (uint64_t)::operator_new(0x48);
    local_d9 = 1;
    local_e8 = local_30[0]._content;
    local_f0 = local_38._content;
    t2_01._content._7_1_ = in_stack_fffffffffffffe6f;
    t2_01._content._0_7_ = in_stack_fffffffffffffe68;
    DisagreementSetIterator::DisagreementSetIterator
              (in_stack_fffffffffffffe60,(TermList)local_d8,t2_01,(bool)uVar2);
    Lib::vi<std::pair<Kernel::TermList,Kernel::TermList>>(in_stack_fffffffffffffe28);
    local_f1 = 1;
    Lib::
    IterTraits<Lib::CatIterator<Lib::VirtualIterator<std::pair<Kernel::TermList,_Kernel::TermList>_>,_Lib::IterTraits<Lib::VirtualIterator<std::pair<Kernel::TermList,_Kernel::TermList>_>_>_>_>
    ::IterTraits((IterTraits<Lib::CatIterator<Lib::VirtualIterator<std::pair<Kernel::TermList,_Kernel::TermList>_>,_Lib::IterTraits<Lib::VirtualIterator<std::pair<Kernel::TermList,_Kernel::TermList>_>_>_>_>
                  *)CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30),
                 (IterTraits<Lib::CatIterator<Lib::VirtualIterator<std::pair<Kernel::TermList,_Kernel::TermList>_>,_Lib::IterTraits<Lib::VirtualIterator<std::pair<Kernel::TermList,_Kernel::TermList>_>_>_>_>
                  *)in_stack_fffffffffffffe28);
    local_111 = 1;
    Lib::
    concatIters<Lib::VirtualIterator<std::pair<Kernel::TermList,Kernel::TermList>>,Lib::IterTraits<Lib::CatIterator<Lib::VirtualIterator<std::pair<Kernel::TermList,Kernel::TermList>>,Lib::IterTraits<Lib::VirtualIterator<std::pair<Kernel::TermList,Kernel::TermList>>>>>>
              ((VirtualIterator<std::pair<Kernel::TermList,_Kernel::TermList>_> *)
               in_stack_fffffffffffffeb8._content,
               (IterTraits<Lib::CatIterator<Lib::VirtualIterator<std::pair<Kernel::TermList,_Kernel::TermList>_>,_Lib::IterTraits<Lib::VirtualIterator<std::pair<Kernel::TermList,_Kernel::TermList>_>_>_>_>
                *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0));
    local_112 = 1;
    Lib::
    pvi<Lib::IterTraits<Lib::CatIterator<Lib::VirtualIterator<std::pair<Kernel::TermList,Kernel::TermList>>,Lib::IterTraits<Lib::IterTraits<Lib::CatIterator<Lib::VirtualIterator<std::pair<Kernel::TermList,Kernel::TermList>>,Lib::IterTraits<Lib::VirtualIterator<std::pair<Kernel::TermList,Kernel::TermList>>>>>>>>>
              (it);
  }
  if ((local_131 & 1) != 0) {
    Lib::
    IterTraits<Lib::CatIterator<Lib::VirtualIterator<std::pair<Kernel::TermList,_Kernel::TermList>_>,_Lib::IterTraits<Lib::VirtualIterator<std::pair<Kernel::TermList,_Kernel::TermList>_>_>_>_>
    ::~IterTraits((IterTraits<Lib::CatIterator<Lib::VirtualIterator<std::pair<Kernel::TermList,_Kernel::TermList>_>,_Lib::IterTraits<Lib::VirtualIterator<std::pair<Kernel::TermList,_Kernel::TermList>_>_>_>_>
                   *)0x8ae3f6);
  }
  if ((local_112 & 1) != 0) {
    Lib::
    IterTraits<Lib::CatIterator<Lib::VirtualIterator<std::pair<Kernel::TermList,_Kernel::TermList>_>,_Lib::IterTraits<Lib::IterTraits<Lib::CatIterator<Lib::VirtualIterator<std::pair<Kernel::TermList,_Kernel::TermList>_>,_Lib::IterTraits<Lib::VirtualIterator<std::pair<Kernel::TermList,_Kernel::TermList>_>_>_>_>_>_>_>
    ::~IterTraits((IterTraits<Lib::CatIterator<Lib::VirtualIterator<std::pair<Kernel::TermList,_Kernel::TermList>_>,_Lib::IterTraits<Lib::IterTraits<Lib::CatIterator<Lib::VirtualIterator<std::pair<Kernel::TermList,_Kernel::TermList>_>,_Lib::IterTraits<Lib::VirtualIterator<std::pair<Kernel::TermList,_Kernel::TermList>_>_>_>_>_>_>_>
                   *)0x8ae40f);
  }
  if ((local_111 & 1) != 0) {
    Lib::
    IterTraits<Lib::CatIterator<Lib::VirtualIterator<std::pair<Kernel::TermList,_Kernel::TermList>_>,_Lib::IterTraits<Lib::VirtualIterator<std::pair<Kernel::TermList,_Kernel::TermList>_>_>_>_>
    ::~IterTraits((IterTraits<Lib::CatIterator<Lib::VirtualIterator<std::pair<Kernel::TermList,_Kernel::TermList>_>,_Lib::IterTraits<Lib::VirtualIterator<std::pair<Kernel::TermList,_Kernel::TermList>_>_>_>_>
                   *)0x8ae428);
  }
  if ((local_f1 & 1) != 0) {
    Lib::VirtualIterator<std::pair<Kernel::TermList,_Kernel::TermList>_>::~VirtualIterator
              ((VirtualIterator<std::pair<Kernel::TermList,_Kernel::TermList>_> *)
               CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30));
  }
  do {
    bVar1 = Lib::VirtualIterator<std::pair<Kernel::TermList,_Kernel::TermList>_>::hasNext
                      ((VirtualIterator<std::pair<Kernel::TermList,_Kernel::TermList>_> *)0x8ae450);
    if (!bVar1) {
      uVar7 = Lib::DHMap<unsigned_int,_unsigned_int,_Lib::IdentityHash,_Lib::DefaultHash>::size
                        (&haveReversedVariantArgs::leftToRight);
      in_stack_fffffffffffffe34 =
           Lib::DHMap<unsigned_int,_unsigned_int,_Lib::IdentityHash,_Lib::DefaultHash>::size
                     (&haveReversedVariantArgs::rightToLeft);
      if (uVar7 == in_stack_fffffffffffffe34) {
        local_1 = 1;
      }
      else {
        local_1 = 0;
      }
      goto LAB_008ae7f6;
    }
    pVar9 = Lib::VirtualIterator<std::pair<Kernel::TermList,_Kernel::TermList>_>::next
                      ((VirtualIterator<std::pair<Kernel::TermList,_Kernel::TermList>_> *)0x8ae470);
    local_140 = pVar9.second._content;
    uVar2 = TermList::isVar((TermList *)
                            CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30));
    if ((!(bool)uVar2) ||
       (uVar3 = TermList::isVar((TermList *)
                                CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30)),
       !(bool)uVar3)) {
      local_1 = 0;
      goto LAB_008ae7f6;
    }
    uVar5 = TermList::var((TermList *)&stack0xfffffffffffffeb8);
    uVar10 = uVar5;
    key = TermList::var(&local_140);
    uVar7 = key;
    uVar6 = Lib::DHMap<unsigned_int,_unsigned_int,_Lib::IdentityHash,_Lib::DefaultHash>::
            findOrInsert((DHMap<unsigned_int,_unsigned_int,_Lib::IdentityHash,_Lib::DefaultHash> *)
                         CONCAT17(uVar2,CONCAT16(uVar3,CONCAT24(in_stack_fffffffffffffe54,uVar5))),
                         key,(uint *)CONCAT44(key,in_stack_fffffffffffffe40));
    if (key != uVar6) {
      local_1 = 0;
      goto LAB_008ae7f6;
    }
    in_stack_fffffffffffffe40 =
         Lib::DHMap<unsigned_int,_unsigned_int,_Lib::IdentityHash,_Lib::DefaultHash>::findOrInsert
                   ((DHMap<unsigned_int,_unsigned_int,_Lib::IdentityHash,_Lib::DefaultHash> *)
                    CONCAT17(uVar2,CONCAT16(uVar3,CONCAT24(in_stack_fffffffffffffe54,uVar5))),uVar7,
                    (uint *)CONCAT44(key,in_stack_fffffffffffffe40));
  } while (uVar10 == in_stack_fffffffffffffe40);
  local_1 = 0;
LAB_008ae7f6:
  Lib::VirtualIterator<std::pair<Kernel::TermList,_Kernel::TermList>_>::~VirtualIterator
            ((VirtualIterator<std::pair<Kernel::TermList,_Kernel::TermList>_> *)
             CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30));
  Lib::
  IterTraits<Lib::CatIterator<Lib::VirtualIterator<std::pair<Kernel::TermList,_Kernel::TermList>_>,_Lib::IterTraits<Lib::VirtualIterator<std::pair<Kernel::TermList,_Kernel::TermList>_>_>_>_>
  ::~IterTraits((IterTraits<Lib::CatIterator<Lib::VirtualIterator<std::pair<Kernel::TermList,_Kernel::TermList>_>,_Lib::IterTraits<Lib::VirtualIterator<std::pair<Kernel::TermList,_Kernel::TermList>_>_>_>_>
                 *)0x8ae810);
LAB_008ae821:
  return (bool)(local_1 & 1);
}

Assistant:

bool MatchingUtils::haveReversedVariantArgs(Term* l1, Term* l2)
{
  ASS_EQ(l1->arity(), 2);
  ASS_EQ(l2->arity(), 2);

  static DHMap<unsigned,unsigned,IdentityHash,DefaultHash> leftToRight;
  static DHMap<unsigned,unsigned,IdentityHash,DefaultHash> rightToLeft;
  leftToRight.reset();
  rightToLeft.reset();

  TermList s1, s2;
  bool sortUsed = false;
  if(l1->isLiteral() && static_cast<Literal*>(l1)->isTwoVarEquality())
  {
    if(l2->isLiteral() && static_cast<Literal*>(l2)->isTwoVarEquality()){
       s1 = SortHelper::getEqualityArgumentSort(static_cast<Literal*>(l1));
       s2 = SortHelper::getEqualityArgumentSort(static_cast<Literal*>(l2));
       sortUsed = true;
    } else {
      return false;
    }
  }

  auto it1 = concatIters(
      vi( new DisagreementSetIterator(*l1->nthArgument(0),*l2->nthArgument(1)) ),
      vi( new DisagreementSetIterator(*l1->nthArgument(1),*l2->nthArgument(0)) ));

  VirtualIterator<pair<TermList, TermList> > dsit =
  sortUsed ? pvi(concatIters(vi(new DisagreementSetIterator(s1,s2)), it1)) :
             pvi(it1);

  while(dsit.hasNext()) {
    pair<TermList,TermList> dp=dsit.next(); //disagreement pair
    if(!dp.first.isVar() || !dp.second.isVar()) {
  return false;
    }
    unsigned left=dp.first.var();
    unsigned right=dp.second.var();
    if(right!=leftToRight.findOrInsert(left,right)) {
  return false;
    }
    if(left!=rightToLeft.findOrInsert(right,left)) {
  return false;
    }
  }
  if(leftToRight.size()!=rightToLeft.size()) {
    return false;
  }

  return true;
}